

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CHUNKcode Curl_httpchunk_read(connectdata *conn,char *datap,ssize_t datalen,ssize_t *wrotep)

{
  undefined1 uVar1;
  CURLcode CVar2;
  int iVar3;
  CURLofft CVar4;
  size_t sVar5;
  size_t *local_88;
  void *local_78;
  char *ptr;
  char *endptr;
  size_t *wrote;
  curl_off_t length;
  size_t piece;
  SingleRequest *k;
  Curl_chunker *ch;
  Curl_easy *data;
  ssize_t *psStack_30;
  CURLcode result;
  ssize_t *wrotep_local;
  ssize_t datalen_local;
  char *datap_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  ch = (Curl_chunker *)conn->data;
  k = (SingleRequest *)&conn->chunk;
  piece = (size_t)&((Curl_easy *)ch)->req;
  *wrotep = 0;
  endptr = (char *)wrotep;
  wrote = (size_t *)datalen;
  psStack_30 = wrotep;
  wrotep_local = (ssize_t *)datalen;
  datalen_local = (ssize_t)datap;
  datap_local = (char *)conn;
  if (((((((Curl_easy *)ch)->set).http_te_skip & 1U) != 0) &&
      (((((Curl_easy *)ch)->req).ignorebody & 1U) == 0)) &&
     (CVar2 = Curl_client_write(conn,1,datap,datalen), CVar2 != CURLE_OK)) {
    return CHUNKE_WRITE_ERROR;
  }
  data._4_4_ = CURLE_OK;
  do {
    if (wrote == (size_t *)0x0) {
      return CHUNKE_OK;
    }
    switch(*(undefined4 *)&k->writebytecountp) {
    case 0:
      iVar3 = Curl_isxdigit((int)*(char *)datalen_local);
      if (iVar3 == 0) {
        if (*(int *)((long)&k->maxdownload + 4) == 0) {
          return CHUNKE_ILLEGAL_HEX;
        }
        *(undefined1 *)((long)&k->size + (long)*(int *)((long)&k->maxdownload + 4)) = 0;
        data._4_4_ = CURLE_OK;
        CVar4 = curlx_strtoofft((char *)k,&ptr,0x10,&k->bytecount);
        if (CVar4 != CURL_OFFT_OK) {
          return CHUNKE_ILLEGAL_HEX;
        }
        *(undefined4 *)&k->writebytecountp = 1;
      }
      else {
        if (0xf < *(int *)((long)&k->maxdownload + 4)) {
          return CHUNKE_TOO_LONG_HEX;
        }
        *(undefined1 *)((long)&k->size + (long)*(int *)((long)&k->maxdownload + 4)) =
             *(undefined1 *)datalen_local;
        datalen_local = datalen_local + 1;
        wrote = (size_t *)((long)wrote + -1);
        *(int *)((long)&k->maxdownload + 4) = *(int *)((long)&k->maxdownload + 4) + 1;
      }
      break;
    case 1:
      if (*(char *)datalen_local == '\n') {
        if (k->bytecount == 0) {
          *(undefined4 *)&k->writebytecountp = 5;
          datap_local[0x644] = '\0';
          datap_local[0x645] = '\0';
          datap_local[0x646] = '\0';
          datap_local[0x647] = '\0';
        }
        else {
          *(undefined4 *)&k->writebytecountp = 2;
        }
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 2:
      if (k->bytecount < (long)wrote) {
        local_88 = (size_t *)k->bytecount;
      }
      else {
        local_88 = wrote;
      }
      length = curlx_sotouz((curl_off_t)local_88);
      if (((*(byte *)(*(long *)datap_local + 0xc58) & 1) == 0) &&
         ((*(byte *)(piece + 0xf9) & 1) == 0)) {
        if (((*(byte *)(*(long *)datap_local + 0xc59) & 1) == 0) && (*(long *)(piece + 0xd0) != 0))
        {
          data._4_4_ = Curl_unencode_write((connectdata *)datap_local,
                                           *(contenc_writer **)(piece + 0xd0),(char *)datalen_local,
                                           length);
        }
        else {
          data._4_4_ = Curl_client_write((connectdata *)datap_local,1,(char *)datalen_local,length);
        }
        if (data._4_4_ != CURLE_OK) {
          return CHUNKE_WRITE_ERROR;
        }
      }
      *(curl_off_t *)endptr = length + *(long *)endptr;
      k->bytecount = k->bytecount - length;
      datalen_local = length + datalen_local;
      wrote = (size_t *)((long)wrote - length);
      if (k->bytecount == 0) {
        *(undefined4 *)&k->writebytecountp = 3;
      }
      break;
    case 3:
      if (*(char *)datalen_local == '\n') {
        Curl_httpchunk_init((connectdata *)datap_local);
      }
      else if (*(char *)datalen_local != '\r') {
        return CHUNKE_BAD_CHUNK;
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 4:
      if (*(char *)datalen_local == '\n') {
        wrote = (size_t *)((long)wrote + -1);
        sVar5 = curlx_sotouz((curl_off_t)wrote);
        k->writebytecount = sVar5;
        return CHUNKE_STOP;
      }
      return CHUNKE_BAD_CHUNK;
    case 5:
      if ((*(char *)datalen_local == '\r') || (*(char *)datalen_local == '\n')) {
        if (*(int *)(datap_local + 0x644) == 0) {
          *(undefined4 *)&k->writebytecountp = 7;
          break;
        }
        iVar3 = *(int *)(datap_local + 0x644);
        *(int *)(datap_local + 0x644) = iVar3 + 1;
        *(undefined1 *)(*(long *)(datap_local + 0x638) + (long)iVar3) = 0xd;
        iVar3 = *(int *)(datap_local + 0x644);
        *(int *)(datap_local + 0x644) = iVar3 + 1;
        *(undefined1 *)(*(long *)(datap_local + 0x638) + (long)iVar3) = 10;
        *(undefined1 *)(*(long *)(datap_local + 0x638) + (long)*(int *)(datap_local + 0x644)) = 0;
        data._4_4_ = 0;
        if (((ch[0x41].dataleft & 1) == 0) &&
           (CVar2 = Curl_client_write((connectdata *)datap_local,2,*(char **)(datap_local + 0x638),
                                      (long)*(int *)(datap_local + 0x644)), CVar2 != CURLE_OK)) {
          return CHUNKE_WRITE_ERROR;
        }
        data._4_4_ = CURLE_OK;
        datap_local[0x644] = '\0';
        datap_local[0x645] = '\0';
        datap_local[0x646] = '\0';
        datap_local[0x647] = '\0';
        *(undefined4 *)&k->writebytecountp = 6;
        if (*(char *)datalen_local == '\n') break;
      }
      else {
        if (*(int *)(datap_local + 0x640) <= *(int *)(datap_local + 0x644)) {
          if (*(int *)(datap_local + 0x640) == 0) {
            datap_local[0x640] = -0x80;
            datap_local[0x641] = '\0';
            datap_local[0x642] = '\0';
            datap_local[0x643] = '\0';
            local_78 = (*Curl_cmalloc)((long)(*(int *)(datap_local + 0x640) + 3));
          }
          else {
            *(int *)(datap_local + 0x640) = *(int *)(datap_local + 0x640) << 1;
            local_78 = (*Curl_crealloc)(*(void **)(datap_local + 0x638),
                                        (long)(*(int *)(datap_local + 0x640) + 3));
          }
          if (local_78 == (void *)0x0) {
            return CHUNKE_OUT_OF_MEMORY;
          }
          *(void **)(datap_local + 0x638) = local_78;
        }
        uVar1 = *(undefined1 *)datalen_local;
        iVar3 = *(int *)(datap_local + 0x644);
        *(int *)(datap_local + 0x644) = iVar3 + 1;
        *(undefined1 *)(*(long *)(datap_local + 0x638) + (long)iVar3) = uVar1;
      }
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 6:
      if (*(char *)datalen_local != '\n') {
        return CHUNKE_BAD_CHUNK;
      }
      *(undefined4 *)&k->writebytecountp = 7;
      datalen_local = datalen_local + 1;
      wrote = (size_t *)((long)wrote + -1);
      break;
    case 7:
      if ((*(char *)datalen_local == '\r') || (*(char *)datalen_local == '\n')) {
        if (*(char *)datalen_local == '\r') {
          datalen_local = datalen_local + 1;
          wrote = (size_t *)((long)wrote + -1);
        }
        *(undefined4 *)&k->writebytecountp = 4;
      }
      else {
        *(undefined4 *)&k->writebytecountp = 5;
      }
    }
  } while( true );
}

Assistant:

CHUNKcode Curl_httpchunk_read(struct connectdata *conn,
                              char *datap,
                              ssize_t datalen,
                              ssize_t *wrotep)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct Curl_chunker *ch = &conn->chunk;
  struct SingleRequest *k = &data->req;
  size_t piece;
  curl_off_t length = (curl_off_t)datalen;
  size_t *wrote = (size_t *)wrotep;

  *wrote = 0; /* nothing's written yet */

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length*/
  if(data->set.http_te_skip && !k->ignorebody) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, datap, datalen);
    if(result)
      return CHUNKE_WRITE_ERROR;
  }

  while(length) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(Curl_isxdigit_ascii(*datap)) {
        if(ch->hexindex < MAXNUM_SIZE) {
          ch->hexbuffer[ch->hexindex] = *datap;
          datap++;
          length--;
          ch->hexindex++;
        }
        else {
          return CHUNKE_TOO_LONG_HEX; /* longer hex than we support */
        }
      }
      else {
        char *endptr;
        if(0 == ch->hexindex)
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          return CHUNKE_ILLEGAL_HEX;

        /* length and datap are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;

        /* convert to host encoding before calling strtoul */
        result = Curl_convert_from_network(conn->data, ch->hexbuffer,
                                           ch->hexindex);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          /* Treat it as a bad hex character */
          return CHUNKE_ILLEGAL_HEX;
        }

        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize))
          return CHUNKE_ILLEGAL_HEX;
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*datap == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
          conn->trlPos = 0;
        }
        else
          ch->state = CHUNK_DATA;
      }

      datap++;
      length--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'length' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = curlx_sotouz((ch->datasize >= length)?length:ch->datasize);

      /* Write the data portion available */
      if(!conn->data->set.http_te_skip && !k->ignorebody) {
        if(!conn->data->set.http_ce_skip && k->writer_stack)
          result = Curl_unencode_write(conn, k->writer_stack, datap, piece);
        else
          result = Curl_client_write(conn, CLIENTWRITE_BODY, datap, piece);

        if(result)
          return CHUNKE_WRITE_ERROR;
      }

      *wrote += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      datap += piece;    /* move read pointer forward */
      length -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*datap == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_init(conn); /* sets state back to CHUNK_HEX */
      }
      else if(*datap != 0x0d)
        return CHUNKE_BAD_CHUNK;
      datap++;
      length--;
      break;

    case CHUNK_TRAILER:
      if((*datap == 0x0d) || (*datap == 0x0a)) {
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(conn->trlPos) {
          /* we allocate trailer with 3 bytes extra room to fit this */
          conn->trailer[conn->trlPos++] = 0x0d;
          conn->trailer[conn->trlPos++] = 0x0a;
          conn->trailer[conn->trlPos] = 0;

          /* Convert to host encoding before calling Curl_client_write */
          result = Curl_convert_from_network(conn->data, conn->trailer,
                                             conn->trlPos);
          if(result)
            /* Curl_convert_from_network calls failf if unsuccessful */
            /* Treat it as a bad chunk */
            return CHUNKE_BAD_CHUNK;

          if(!data->set.http_te_skip) {
            result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                       conn->trailer, conn->trlPos);
            if(result)
              return CHUNKE_WRITE_ERROR;
          }
          conn->trlPos = 0;
          ch->state = CHUNK_TRAILER_CR;
          if(*datap == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        /* conn->trailer is assumed to be freed in url.c on a
           connection basis */
        if(conn->trlPos >= conn->trlMax) {
          /* we always allocate three extra bytes, just because when the full
             header has been received we append CRLF\0 */
          char *ptr;
          if(conn->trlMax) {
            conn->trlMax *= 2;
            ptr = realloc(conn->trailer, conn->trlMax + 3);
          }
          else {
            conn->trlMax = 128;
            ptr = malloc(conn->trlMax + 3);
          }
          if(!ptr)
            return CHUNKE_OUT_OF_MEMORY;
          conn->trailer = ptr;
        }
        conn->trailer[conn->trlPos++]=*datap;
      }
      datap++;
      length--;
      break;

    case CHUNK_TRAILER_CR:
      if(*datap == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        datap++;
        length--;
      }
      else
        return CHUNKE_BAD_CHUNK;
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*datap != 0x0d) && (*datap != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*datap == 0x0d) {
        /* skip if CR */
        datap++;
        length--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*datap == 0x0a) {
        length--;

        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->dataleft = curlx_sotouz(length);

        return CHUNKE_STOP; /* return stop */
      }
      else
        return CHUNKE_BAD_CHUNK;
    }
  }
  return CHUNKE_OK;
}